

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O2

uint __thiscall
llvm::DWARFVerifier::verifyAbbrevSection(DWARFVerifier *this,DWARFDebugAbbrev *Abbrev)

{
  pointer pDVar1;
  undefined8 uVar2;
  uint uVar3;
  DWARFAbbreviationDeclarationSet *pDVar4;
  raw_ostream *prVar5;
  pointer pDVar6;
  uint Attribute;
  ulong uVar7;
  long lVar8;
  StringRef Str;
  undefined1 local_128 [8];
  DWARFAbbreviationDeclaration AbbrDecl;
  pair<llvm::detail::DenseSetImpl<unsigned_short,_llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_llvm::DenseMapInfo<unsigned_short>_>::Iterator,_bool>
  Result;
  SmallDenseSet<unsigned_short,_4U,_llvm::DenseMapInfo<unsigned_short>_> AttributeSet;
  ushort local_32;
  
  uVar3 = 0;
  if (Abbrev != (DWARFDebugAbbrev *)0x0) {
    pDVar4 = DWARFDebugAbbrev::getAbbreviationDeclarationSet(Abbrev,0);
    pDVar1 = (pDVar4->Decls).
             super__Vector_base<llvm::DWARFAbbreviationDeclaration,_std::allocator<llvm::DWARFAbbreviationDeclaration>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pDVar6 = (pDVar4->Decls).
                  super__Vector_base<llvm::DWARFAbbreviationDeclaration,_std::allocator<llvm::DWARFAbbreviationDeclaration>_>
                  ._M_impl.super__Vector_impl_data._M_start; pDVar6 != pDVar1; pDVar6 = pDVar6 + 1)
    {
      DWARFAbbreviationDeclaration::DWARFAbbreviationDeclaration
                ((DWARFAbbreviationDeclaration *)local_128,pDVar6);
      SmallDenseSet<unsigned_short,_4U,_llvm::DenseMapInfo<unsigned_short>_>::SmallDenseSet
                ((SmallDenseSet<unsigned_short,_4U,_llvm::DenseMapInfo<unsigned_short>_> *)
                 &Result.second);
      uVar2 = AbbrDecl._0_8_;
      uVar7 = (ulong)(uint)AbbrDecl.AttributeSpecs.
                           super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
                           super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                           .
                           super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                           .super_SmallVectorBase.BeginX;
      for (lVar8 = 0; uVar7 << 4 != lVar8; lVar8 = lVar8 + 0x10) {
        local_32 = *(ushort *)(uVar2 + lVar8);
        Attribute = (uint)local_32;
        detail::
        DenseSetImpl<unsigned_short,_llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_llvm::DenseMapInfo<unsigned_short>_>
        ::insert((pair<llvm::detail::DenseSetImpl<unsigned_short,_llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_llvm::DenseMapInfo<unsigned_short>_>::Iterator,_bool>
                  *)&AbbrDecl.FixedAttributeSize,
                 (DenseSetImpl<unsigned_short,_llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_llvm::DenseMapInfo<unsigned_short>_>
                  *)&Result.second,&local_32);
        if ((char)Result.first.I.End == '\0') {
          prVar5 = error(this);
          prVar5 = raw_ostream::operator<<(prVar5,"Abbreviation declaration contains multiple ");
          Str = dwarf::AttributeString(Attribute);
          prVar5 = raw_ostream::operator<<(prVar5,Str);
          raw_ostream::operator<<(prVar5," attributes.\n");
          DWARFAbbreviationDeclaration::dump((DWARFAbbreviationDeclaration *)local_128,this->OS);
          uVar3 = uVar3 + 1;
        }
      }
      SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
      ::~SmallDenseMap((SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
                        *)&Result.second);
      SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>::~SmallVectorImpl
                ((SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec> *)&AbbrDecl);
    }
  }
  return uVar3;
}

Assistant:

unsigned DWARFVerifier::verifyAbbrevSection(const DWARFDebugAbbrev *Abbrev) {
  unsigned NumErrors = 0;
  if (Abbrev) {
    const DWARFAbbreviationDeclarationSet *AbbrDecls =
        Abbrev->getAbbreviationDeclarationSet(0);
    for (auto AbbrDecl : *AbbrDecls) {
      SmallDenseSet<uint16_t> AttributeSet;
      for (auto Attribute : AbbrDecl.attributes()) {
        auto Result = AttributeSet.insert(Attribute.Attr);
        if (!Result.second) {
          error() << "Abbreviation declaration contains multiple "
                  << AttributeString(Attribute.Attr) << " attributes.\n";
          AbbrDecl.dump(OS);
          ++NumErrors;
        }
      }
    }
  }
  return NumErrors;
}